

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImGuiContext *pIVar1;
  ImRect local_18;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != window) {
    __assert_fail("window == g.NavWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x298e,"void ImGui::NavInitWindow(ImGuiWindow *, bool)");
  }
  if (((uint)window->Flags >> 0x12 & 1) == 0) {
    if (((((uint)window->Flags >> 0x1a & 1) != 0) || (window->RootWindow == window)) ||
       (window->NavLastIds[0] == 0 || force_reinit)) {
      local_18.Min.x = 0.0;
      local_18.Min.y = 0.0;
      local_18.Max.x = 0.0;
      local_18.Max.y = 0.0;
      SetNavID(0,GImGui->NavLayer,0,&local_18);
      pIVar1->NavInitRequest = true;
      pIVar1->NavInitRequestFromMove = false;
      pIVar1->NavInitResultId = 0;
      (pIVar1->NavInitResultRectRel).Min.x = 0.0;
      (pIVar1->NavInitResultRectRel).Min.y = 0.0;
      (pIVar1->NavInitResultRectRel).Max.x = 0.0;
      (pIVar1->NavInitResultRectRel).Max.y = 0.0;
      NavUpdateAnyRequestFlag();
      return;
    }
    GImGui->NavId = window->NavLastIds[0];
    pIVar1->NavFocusScopeId = 0;
  }
  else {
    pIVar1->NavId = 0;
    pIVar1->NavFocusScopeId = 0;
  }
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    // FIXME: ChildWindow test here is wrong for docking
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);

    if (window->Flags & ImGuiWindowFlags_NoNavInputs)
    {
        g.NavId = g.NavFocusScopeId = 0;
        return;
    }

    bool init_for_nav = false;
    if (window == window->RootWindow || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
        init_for_nav = true;
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer, 0, ImRect());
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
        g.NavFocusScopeId = 0;
    }
}